

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O1

void __thiscall rengine::OpenGLRenderer::projectQuad(OpenGLRenderer *this,vec2 a,vec2 b,vec2 *v)

{
  mat4 *this_00;
  vec2 vVar1;
  vec2 vVar2;
  vec2 vVar3;
  vec2 vVar4;
  float fVar5;
  float fVar6;
  vec3 vVar7;
  vec3 v_00;
  vec3 v_01;
  vec3 v_02;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  
  this_00 = &this->m_m3d;
  vVar7.z = 0.0;
  vVar7._0_8_ = a;
  vVar7 = mat4::operator*(this_00,vVar7);
  fVar6 = (this->m_farPlane - vVar7.z) / this->m_farPlane;
  fVar5 = vVar7.x / fVar6;
  fVar6 = vVar7.y / fVar6;
  vVar1.y = fVar5 * (this->m_m2d).m[4] + fVar6 * (this->m_m2d).m[5] + (this->m_m2d).m[7];
  vVar1.x = (this->m_m2d).m[0] * fVar5 + (this->m_m2d).m[1] * fVar6 + (this->m_m2d).m[3];
  *v = vVar1;
  fStack_34 = b.y;
  local_48 = a.x;
  v_00.y = fStack_34;
  v_00.x = local_48;
  v_00.z = 0.0;
  vVar7 = mat4::operator*(this_00,v_00);
  fVar6 = (this->m_farPlane - vVar7.z) / this->m_farPlane;
  fVar5 = vVar7.x / fVar6;
  fVar6 = vVar7.y / fVar6;
  vVar2.y = fVar5 * (this->m_m2d).m[4] + fVar6 * (this->m_m2d).m[5] + (this->m_m2d).m[7];
  vVar2.x = (this->m_m2d).m[0] * fVar5 + (this->m_m2d).m[1] * fVar6 + (this->m_m2d).m[3];
  v[1] = vVar2;
  local_38 = b.x;
  fStack_44 = a.y;
  v_01.y = fStack_44;
  v_01.x = local_38;
  v_01.z = 0.0;
  vVar7 = mat4::operator*(this_00,v_01);
  fVar6 = (this->m_farPlane - vVar7.z) / this->m_farPlane;
  fVar5 = vVar7.x / fVar6;
  fVar6 = vVar7.y / fVar6;
  vVar3.y = fVar5 * (this->m_m2d).m[4] + fVar6 * (this->m_m2d).m[5] + (this->m_m2d).m[7];
  vVar3.x = (this->m_m2d).m[0] * fVar5 + (this->m_m2d).m[1] * fVar6 + (this->m_m2d).m[3];
  v[2] = vVar3;
  v_02.z = 0.0;
  v_02._0_8_ = b;
  vVar7 = mat4::operator*(this_00,v_02);
  fVar6 = (this->m_farPlane - vVar7.z) / this->m_farPlane;
  fVar5 = vVar7.x / fVar6;
  fVar6 = vVar7.y / fVar6;
  vVar4.y = fVar5 * (this->m_m2d).m[4] + fVar6 * (this->m_m2d).m[5] + (this->m_m2d).m[7];
  vVar4.x = (this->m_m2d).m[0] * fVar5 + (this->m_m2d).m[1] * fVar6 + (this->m_m2d).m[3];
  v[3] = vVar4;
  return;
}

Assistant:

inline void OpenGLRenderer::projectQuad(vec2 a, vec2 b, vec2 *v)
{
    // The steps involved in each line is as follows.:
    // pt_3d = matrix3D * pt                 // apply the 3D transform
    // pt_proj = pt_3d.project2D()           // project it to 2D based on current farPlane
    // pt_screen = parent_matrix * pt_proj   // Put the output of our local 3D into the scene world coordinate system
    v[0] = m_m2d * ((m_m3d * vec3(a))       .project2D(m_farPlane));    // top left
    v[1] = m_m2d * ((m_m3d * vec3(a.x, b.y)).project2D(m_farPlane));    // bottom left
    v[2] = m_m2d * ((m_m3d * vec3(b.x, a.y)).project2D(m_farPlane));    // top right
    v[3] = m_m2d * ((m_m3d * vec3(b))       .project2D(m_farPlane));    // bottom right
}